

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::ImageClearingTestInstance
          (ImageClearingTestInstance *this,Context *context,TestParams_conflict *params)

{
  VkExtent3D *pVVar1;
  VkImageView imageView;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  RefData<vk::Handle<(vk::HandleType)17>_> data_03;
  RefData<vk::Handle<(vk::HandleType)23>_> data_04;
  bool bVar2;
  deUint32 dVar3;
  VkImageUsageFlags VVar4;
  VkImageAspectFlags VVar5;
  VkImageViewType viewType;
  VkDevice pVVar6;
  InstanceInterface *pIVar7;
  DeviceInterface *pDVar8;
  VkQueue pVVar9;
  Allocator *pAVar10;
  uint *puVar11;
  Handle<(vk::HandleType)24> *pHVar12;
  Handle<(vk::HandleType)9> *pHVar13;
  Handle<(vk::HandleType)13> *pHVar14;
  Handle<(vk::HandleType)17> *pHVar15;
  deUint32 local_2a4;
  Move<vk::Handle<(vk::HandleType)23>_> local_1f0;
  RefData<vk::Handle<(vk::HandleType)23>_> local_1d0;
  Move<vk::Handle<(vk::HandleType)17>_> local_1b0;
  RefData<vk::Handle<(vk::HandleType)17>_> local_190;
  VkImage local_170;
  Move<vk::Handle<(vk::HandleType)13>_> local_168;
  RefData<vk::Handle<(vk::HandleType)13>_> local_148;
  deUint64 local_128;
  undefined8 local_120;
  deUint32 local_118;
  undefined8 local_110;
  deUint32 local_108;
  Move<vk::Handle<(vk::HandleType)9>_> local_100;
  RefData<vk::Handle<(vk::HandleType)9>_> local_e0;
  deUint64 local_c0;
  Move<vk::VkCommandBuffer_s_*> local_b8;
  RefData<vk::VkCommandBuffer_s_*> local_98;
  Move<vk::Handle<(vk::HandleType)24>_> local_78;
  RefData<vk::Handle<(vk::HandleType)24>_> local_58;
  uint local_34;
  uint local_30 [4];
  TestParams_conflict *local_20;
  TestParams_conflict *params_local;
  Context *context_local;
  ImageClearingTestInstance *this_local;
  
  local_20 = params;
  params_local = (TestParams_conflict *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ImageClearingTestInstance_016a22d0;
  this->m_params = local_20;
  pVVar6 = Context::getDevice((Context *)params_local);
  this->m_device = pVVar6;
  pIVar7 = Context::getInstanceInterface((Context *)params_local);
  this->m_vki = pIVar7;
  pDVar8 = Context::getDeviceInterface((Context *)params_local);
  this->m_vkd = pDVar8;
  pVVar9 = Context::getUniversalQueue((Context *)params_local);
  this->m_queue = pVVar9;
  dVar3 = Context::getUniversalQueueFamilyIndex((Context *)params_local);
  this->m_queueFamilyIndex = dVar3;
  pAVar10 = Context::getDefaultAllocator((Context *)params_local);
  this->m_allocator = pAVar10;
  bVar2 = getIsAttachmentFormat(this,local_20->imageFormat);
  this->m_isAttachmentFormat = bVar2;
  VVar4 = getImageUsageFlags(this,local_20->imageFormat);
  this->m_imageUsageFlags = VVar4;
  VVar5 = getImageAspectFlags(this,local_20->imageFormat);
  this->m_imageAspectFlags = VVar5;
  getImageFormatProperties(&this->m_imageFormatProperties,this);
  if ((local_20->useSingleMipLevel & 1U) == 0) {
    local_2a4 = getNumMipLevels(&local_20->imageExtent,(this->m_imageFormatProperties).maxMipLevels)
    ;
  }
  else {
    local_2a4 = 1;
  }
  this->m_imageMipLevels = local_2a4;
  local_30[0] = this->m_imageMipLevels >> 1;
  local_34 = 1;
  puVar11 = std::max<unsigned_int>(local_30,&local_34);
  this->m_thresholdMipLevel = *puVar11;
  createCommandPool(&local_78,this,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data.object.m_internal = local_58.object.m_internal;
  data.deleter.m_device = local_58.deleter.m_device;
  data.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique(&this->m_commandPool,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_78);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  local_c0 = pHVar12->m_internal;
  allocatePrimaryCommandBuffer(&local_b8,this,(VkCommandPool)local_c0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_98,(Move *)&local_b8);
  data_00.deleter.m_deviceIface = local_98.deleter.m_deviceIface;
  data_00.object = local_98.object;
  data_00.deleter.m_device = local_98.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_98.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique(&this->m_commandBuffer,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_b8);
  local_118 = (local_20->imageExtent).depth;
  pVVar1 = &local_20->imageExtent;
  local_120._0_4_ = pVVar1->width;
  local_120._4_4_ = pVVar1->height;
  local_110 = local_120;
  local_108 = local_118;
  createImage(&local_100,this,local_20->imageType,local_20->imageFormat,*pVVar1,
              this->m_imageUsageFlags);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data_01.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data_01.object.m_internal = local_e0.object.m_internal;
  data_01.deleter.m_device = local_e0.deleter.m_device;
  data_01.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique(&this->m_image,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_100);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_128 = pHVar13->m_internal;
  allocateAndBindImageMemory(&this->m_imageMemory,this,(VkImage)local_128);
  if ((this->m_isAttachmentFormat & 1U) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&local_168);
  }
  else {
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_170.m_internal = pHVar13->m_internal;
    viewType = getCorrespondingImageViewType(this,local_20->imageType);
    createImageView(&local_168,this,local_170,viewType,local_20->imageFormat,
                    this->m_imageAspectFlags);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_148,(Move *)&local_168);
  data_02.deleter.m_deviceIface = local_148.deleter.m_deviceIface;
  data_02.object.m_internal = local_148.object.m_internal;
  data_02.deleter.m_device = local_148.deleter.m_device;
  data_02.deleter.m_allocator = local_148.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique(&this->m_imageView,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_168);
  if ((this->m_isAttachmentFormat & 1U) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&local_1b0);
  }
  else {
    createRenderPass(&local_1b0,this,local_20->imageFormat);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_190,(Move *)&local_1b0);
  data_03.deleter.m_deviceIface = local_190.deleter.m_deviceIface;
  data_03.object.m_internal = local_190.object.m_internal;
  data_03.deleter.m_device = local_190.deleter.m_device;
  data_03.deleter.m_allocator = local_190.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique(&this->m_renderPass,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_1b0);
  if ((this->m_isAttachmentFormat & 1U) == 0) {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&local_1f0);
  }
  else {
    pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                        (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>);
    imageView.m_internal = pHVar14->m_internal;
    pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                        (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
    createFrameBuffer(&local_1f0,this,imageView,(VkRenderPass)pHVar15->m_internal,
                      (local_20->imageExtent).width,(local_20->imageExtent).height);
  }
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d0,(Move *)&local_1f0);
  data_04.deleter.m_deviceIface = local_1d0.deleter.m_deviceIface;
  data_04.object.m_internal = local_1d0.object.m_internal;
  data_04.deleter.m_device = local_1d0.deleter.m_device;
  data_04.deleter.m_allocator = local_1d0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique(&this->m_frameBuffer,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_1f0);
  return;
}

Assistant:

ImageClearingTestInstance::ImageClearingTestInstance (Context& context, const TestParams& params)
	: TestInstance				(context)
	, m_params					(params)
	, m_device					(context.getDevice())
	, m_vki						(context.getInstanceInterface())
	, m_vkd						(context.getDeviceInterface())
	, m_queue					(context.getUniversalQueue())
	, m_queueFamilyIndex		(context.getUniversalQueueFamilyIndex())
	, m_allocator				(context.getDefaultAllocator())
	, m_isAttachmentFormat		(getIsAttachmentFormat(params.imageFormat))
	, m_imageUsageFlags			(getImageUsageFlags(params.imageFormat))
	, m_imageAspectFlags		(getImageAspectFlags(params.imageFormat))
	, m_imageFormatProperties	(getImageFormatProperties())
	, m_imageMipLevels			(params.useSingleMipLevel ? 1u : getNumMipLevels(params.imageExtent, m_imageFormatProperties.maxMipLevels))
	, m_thresholdMipLevel		(std::max(m_imageMipLevels / 2u, 1u))
	, m_commandPool				(createCommandPool(VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT))
	, m_commandBuffer			(allocatePrimaryCommandBuffer(*m_commandPool))

	, m_image					(createImage(params.imageType,
											 params.imageFormat,
											 params.imageExtent,
											 m_imageUsageFlags))

	, m_imageMemory				(allocateAndBindImageMemory(*m_image))
	, m_imageView				(m_isAttachmentFormat ? createImageView(*m_image,
												 getCorrespondingImageViewType(params.imageType),
												 params.imageFormat,
												 m_imageAspectFlags) : vk::Move<VkImageView>())

	, m_renderPass				(m_isAttachmentFormat ? createRenderPass(params.imageFormat) : vk::Move<vk::VkRenderPass>())
	, m_frameBuffer				(m_isAttachmentFormat ? createFrameBuffer(*m_imageView, *m_renderPass, params.imageExtent.width, params.imageExtent.height) : vk::Move<vk::VkFramebuffer>())
{
}